

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.c
# Opt level: O1

_Bool rtosc_match(char *pattern,char *msg,char **path_end)

{
  _Bool _Var1;
  char *pattern_00;
  
  pattern_00 = rtosc_match_path(pattern,msg,path_end);
  if (pattern_00 == (char *)0x0) {
    _Var1 = false;
  }
  else {
    _Var1 = true;
    if (*pattern_00 == ':') {
      _Var1 = rtosc_match_args(pattern_00,msg);
      return _Var1;
    }
  }
  return _Var1;
}

Assistant:

bool rtosc_match(const char *pattern,
                 const char *msg, const char** path_end)
{
    const char *arg_pattern = rtosc_match_path(pattern, msg, path_end);
    if(!arg_pattern)
        return false;
    else if(*arg_pattern == ':')
        return rtosc_match_args(arg_pattern, msg);
    return true;
}